

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroProp.cpp
# Opt level: O2

void __thiscall OpenMD::HydroProp::HydroProp(HydroProp *this)

{
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  (this->name_)._M_string_length = 0;
  (this->name_).field_2._M_local_buf[0] = '\0';
  Vector<double,_3U>::Vector(&(this->cor_).super_Vector<double,_3U>);
  SquareMatrix<double,_6>::SquareMatrix(&this->Xi_);
  SquareMatrix<double,_6>::SquareMatrix(&this->S_);
  this->hasCOR_ = false;
  this->hasXi_ = false;
  this->hasS_ = false;
  return;
}

Assistant:

HydroProp::HydroProp() : hasCOR_(false), hasXi_(false), hasS_(false) {}